

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall QTextStream::setRealNumberPrecision(QTextStream *this,int precision)

{
  QTextStreamPrivate *pQVar1;
  uint in_ESI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *d;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QTextStream *)0x4a86d9);
  if ((int)in_ESI < 0) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
               (int)((ulong)pQVar1 >> 0x20),in_stack_ffffffffffffffb8);
    QMessageLogger::warning
              (&local_28,"QTextStream::setRealNumberPrecision: Invalid precision (%d)",(ulong)in_ESI
              );
    (pQVar1->params).realNumberPrecision = 6;
  }
  else {
    (pQVar1->params).realNumberPrecision = in_ESI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStream::setRealNumberPrecision(int precision)
{
    Q_D(QTextStream);
    if (precision < 0) {
        qWarning("QTextStream::setRealNumberPrecision: Invalid precision (%d)", precision);
        d->params.realNumberPrecision = 6;
        return;
    }
    d->params.realNumberPrecision = precision;
}